

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
               (ostream *out,char *fmt,basic_string_view<char,_std::char_traits<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  long lVar1;
  ostream *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            (in_RDI,in_stack_ffffffffffffff78);
  vformat(in_RSI,(char *)in_RDI,(FormatListRef)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}